

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModelValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)555>(Result *__return_storage_ptr__,Model *format)

{
  value_type *__rhs;
  bool bVar1;
  CustomModel *pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Result *this_00;
  ModelDescription *interface;
  undefined1 local_a0 [40];
  Result result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  const_iterator __begin1;
  
  if (format->_oneof_case_[0] != 0x22b) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"Model not an a CustomModel.",(allocator<char> *)local_a0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
    this_00 = &result;
    goto LAB_00222893;
  }
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result(&result);
  validateModelDescription((Result *)local_a0,interface,format->specificationversion_);
  Result::operator=(&result,(Result *)local_a0);
  std::__cxx11::string::~string((string *)(local_a0 + 8));
  bVar1 = Result::good(&result);
  if (bVar1) {
    pCVar2 = Specification::Model::custommodel(format);
    if (((pCVar2->classname_).ptr_)->_M_string_length != 0) {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
      ::begin(&__begin1,&(pCVar2->parameters_).map_);
      while (__begin1.it_.node_ != (Node *)0x0) {
        __rhs = ((__begin1.it_.node_)->kv).v_;
        if ((__rhs->first)._M_string_length == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,"CustomModel.parameters must have non-empty string keys.",
                     (allocator<char> *)&local_50);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
          goto LAB_0022283c;
        }
        if ((__rhs->second)._oneof_case_[0] == 0) {
          std::operator+(&local_50,"CustomModel.parameters[\'",&__rhs->first);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,&local_50,"\'] does not have a set value");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
          std::__cxx11::string::~string((string *)local_a0);
          this = &local_50;
          goto LAB_00222889;
        }
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        ::InnerMap::
        iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
        ::operator++(&__begin1.it_);
      }
      goto LAB_002227dc;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"CustomModel must have non-empty className.",
               (allocator<char> *)&local_50);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
LAB_0022283c:
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
LAB_00222889:
    std::__cxx11::string::~string((string *)this);
  }
  else {
LAB_002227dc:
    Result::Result(__return_storage_ptr__,&result);
  }
  this_00 = (Result *)&result.m_message;
LAB_00222893:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_customModel>(const Specification::Model& format) {
        const auto& interface = format.description();

        // Make sure that if there is a double output type, there is exactly one output index selected.
        if(!format.has_custommodel()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an a CustomModel.");
        }
        
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        const auto& customModel = format.custommodel();

        if (customModel.classname().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "CustomModel must have non-empty className.");
        }

        const auto& parameters = customModel.parameters();
        for(const auto& param : parameters) {
            if (param.first.empty()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "CustomModel.parameters must have non-empty string keys.");
            }

            switch (param.second.value_case()) {
                case Specification::CustomModel_CustomModelParamValue::VALUE_NOT_SET:
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "CustomModel.parameters['"+param.first+"'] does not have a set value");
                default:
                    break;
            }
        }

        return result;
    }